

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

TPZManVector<TPZTensor<TFad<6,_double>_>,_3> * __thiscall
TPZManVector<TPZTensor<TFad<6,_double>_>,_3>::operator=
          (TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *this,
          TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *copy)

{
  TPZTensor<TFad<6,_double>_> *pTVar1;
  double dVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong *puVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  TFad<6,_double> local_70;
  
  if (this == copy) {
    return this;
  }
  uVar8 = (copy->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements;
  lVar6 = (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc;
  if ((lVar6 < (long)uVar8) &&
     (pTVar1 = (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore,
     pTVar1 != this->fExtAlloc && pTVar1 != (TPZTensor<TFad<6,_double>_> *)0x0)) {
    dVar2 = pTVar1[-1].fData.fExtAlloc[5].dx_[5];
    if (dVar2 != 0.0) {
      lVar6 = (long)dVar2 * 0x1a8;
      do {
        *(undefined ***)((long)pTVar1[-1].fData.fExtAlloc[0].dx_ + lVar6 + -0x38) =
             &PTR__TPZTensor_018777a0;
        TPZManVector<TFad<6,_double>,_6>::~TPZManVector
                  ((TPZManVector<TFad<6,_double>,_6> *)((long)pTVar1 + lVar6 + -0x1a0));
        lVar6 = lVar6 + -0x1a8;
      } while (lVar6 != 0);
    }
    operator_delete__(pTVar1[-1].fData.fExtAlloc[5].dx_ + 5,(long)dVar2 * 0x1a8 + 8);
    lVar6 = 0;
    (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore = (TPZTensor<TFad<6,_double>_> *)0x0;
    (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = 0;
  }
  if ((long)uVar8 < 4) {
    pTVar1 = (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore;
    if (pTVar1 != (TPZTensor<TFad<6,_double>_> *)0x0 && pTVar1 != this->fExtAlloc) {
      dVar2 = pTVar1[-1].fData.fExtAlloc[5].dx_[5];
      if (dVar2 != 0.0) {
        lVar6 = (long)dVar2 * 0x1a8;
        do {
          *(undefined ***)((long)pTVar1[-1].fData.fExtAlloc[0].dx_ + lVar6 + -0x38) =
               &PTR__TPZTensor_018777a0;
          TPZManVector<TFad<6,_double>,_6>::~TPZManVector
                    ((TPZManVector<TFad<6,_double>,_6> *)((long)pTVar1 + lVar6 + -0x1a0));
          lVar6 = lVar6 + -0x1a8;
        } while (lVar6 != 0);
      }
      operator_delete__(pTVar1[-1].fData.fExtAlloc[5].dx_ + 5,(long)dVar2 * 0x1a8 + 8);
    }
    (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = 0;
    (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore = this->fExtAlloc;
  }
  else {
    if ((long)uVar8 <= lVar6) {
      (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements = uVar8;
      goto LAB_00d7d5fa;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar8;
    uVar4 = SUB168(auVar3 * ZEXT816(0x1a8),0);
    uVar7 = uVar4 + 8;
    if (0xfffffffffffffff7 < uVar4) {
      uVar7 = 0xffffffffffffffff;
    }
    if (SUB168(auVar3 * ZEXT816(0x1a8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar7);
    *puVar5 = uVar8;
    lVar6 = 0;
    do {
      *(undefined ***)((long)puVar5 + lVar6 + 8) = &PTR__TPZTensor_018777a0;
      local_70.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_01835938;
      local_70.dx_[3] = 0.0;
      local_70.dx_[4] = 0.0;
      local_70.dx_[1] = 0.0;
      local_70.dx_[2] = 0.0;
      local_70.val_ = 0.0;
      local_70.dx_[0] = 0.0;
      local_70.dx_[5] = 0.0;
      TPZManVector<TFad<6,_double>,_6>::TPZManVector
                ((TPZManVector<TFad<6,_double>,_6> *)((long)puVar5 + lVar6 + 0x10),6,&local_70);
      lVar6 = lVar6 + 0x1a8;
    } while (uVar8 * 0x1a8 != lVar6);
    (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore =
         (TPZTensor<TFad<6,_double>_> *)(puVar5 + 1);
    (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = uVar8;
  }
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements = uVar8;
  if ((long)uVar8 < 1) {
    return this;
  }
LAB_00d7d5fa:
  lVar6 = 8;
  do {
    TPZManVector<TFad<6,_double>,_6>::operator=
              ((TPZManVector<TFad<6,_double>,_6> *)
               ((long)(((this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore)->fData).fExtAlloc
                      [0].dx_ + lVar6 + -0x38),
               (TPZManVector<TFad<6,_double>,_6> *)
               ((long)(((copy->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore)->fData).fExtAlloc
                      [0].dx_ + lVar6 + -0x38));
    lVar6 = lVar6 + 0x1a8;
    uVar8 = uVar8 - 1;
  } while (uVar8 != 0);
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}